

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid)

{
  REF_MPI ref_mpi_00;
  REF_NODE ref_node_00;
  uint uVar1;
  int local_64;
  int local_60;
  int local_5c;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_mpi_00 = ref_grid->mpi;
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[0xb]);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[10]);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[9]);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = ref_cell_free(ref_grid->cell[8]);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 8,REF_CELL_TET);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 9,REF_CELL_PYR);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 10,REF_CELL_PRI);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = ref_cell_create(ref_grid->cell + 0xb,REF_CELL_HEX);
                if (ref_grid_local._4_4_ == 0) {
                  ref_mpi_stopwatch_stop(ref_mpi_00,"dump vol cells");
                  for (ref_private_macro_code_rss_1 = 0;
                      ref_private_macro_code_rss_1 < ref_node_00->max;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    if (((-1 < ref_private_macro_code_rss_1) &&
                        (ref_private_macro_code_rss_1 < ref_node_00->max)) &&
                       (-1 < ref_node_00->global[ref_private_macro_code_rss_1])) {
                      if ((ref_private_macro_code_rss_1 < 0) ||
                         (ref_grid->cell[6]->ref_adj->nnode <= ref_private_macro_code_rss_1)) {
                        local_5c = -1;
                      }
                      else {
                        local_5c = ref_grid->cell[6]->ref_adj->first[ref_private_macro_code_rss_1];
                      }
                      if (local_5c == -1) {
                        if ((ref_private_macro_code_rss_1 < 0) ||
                           (ref_grid->cell[3]->ref_adj->nnode <= ref_private_macro_code_rss_1)) {
                          local_60 = -1;
                        }
                        else {
                          local_60 = ref_grid->cell[3]->ref_adj->first[ref_private_macro_code_rss_1]
                          ;
                        }
                        if (local_60 == -1) {
                          if ((ref_private_macro_code_rss_1 < 0) ||
                             (ref_grid->cell[0]->ref_adj->nnode <= ref_private_macro_code_rss_1)) {
                            local_64 = -1;
                          }
                          else {
                            local_64 = ref_grid->cell[0]->ref_adj->first
                                       [ref_private_macro_code_rss_1];
                          }
                          if ((local_64 == -1) &&
                             (uVar1 = ref_node_remove_invalidates_sorted
                                                (ref_node_00,ref_private_macro_code_rss_1),
                             uVar1 != 0)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                                   ,0x4c5,"ref_grid_drop_volume",(ulong)uVar1,"rm node");
                            return uVar1;
                          }
                        }
                      }
                    }
                  }
                  ref_mpi_stopwatch_stop(ref_mpi_00,"del nodes");
                  ref_grid_local._4_4_ = ref_node_rebuild_sorted_global(ref_node_00);
                  if (ref_grid_local._4_4_ == 0) {
                    ref_mpi_stopwatch_stop(ref_mpi_00,"rebuild nodes");
                    ref_grid_local._4_4_ = ref_node_synchronize_globals(ref_node_00);
                    if (ref_grid_local._4_4_ == 0) {
                      ref_mpi_stopwatch_stop(ref_mpi_00,"sync nodes");
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                             ,0x4cb,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,
                             "sync, lazy delete globals");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                           ,0x4c9,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"rebuild");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                         ,0x4bf,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"hex create");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0x4be,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"pri create");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x4bd,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"pyr create");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x4bc,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"tet create");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x4bb,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"tet free");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x4ba,"ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"pyr free");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x4b9,
             "ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"pri free");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x4b8,
           "ref_grid_drop_volume",(ulong)ref_grid_local._4_4_,"hex free");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_drop_volume(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  RSS(ref_cell_free(ref_grid_hex(ref_grid)), "hex free");
  RSS(ref_cell_free(ref_grid_pri(ref_grid)), "pri free");
  RSS(ref_cell_free(ref_grid_pyr(ref_grid)), "pyr free");
  RSS(ref_cell_free(ref_grid_tet(ref_grid)), "tet free");
  RSS(ref_cell_create(&ref_grid_tet(ref_grid), REF_CELL_TET), "tet create");
  RSS(ref_cell_create(&ref_grid_pyr(ref_grid), REF_CELL_PYR), "pyr create");
  RSS(ref_cell_create(&ref_grid_pri(ref_grid), REF_CELL_PRI), "pri create");
  RSS(ref_cell_create(&ref_grid_hex(ref_grid), REF_CELL_HEX), "hex create");
  ref_mpi_stopwatch_stop(ref_mpi, "dump vol cells");
  each_ref_node_valid_node(ref_node, node) {
    if (ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
        ref_cell_node_empty(ref_grid_edg(ref_grid), node)) {
      RSS(ref_node_remove_invalidates_sorted(ref_node, node), "rm node");
    }
  }
  ref_mpi_stopwatch_stop(ref_mpi, "del nodes");
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");
  ref_mpi_stopwatch_stop(ref_mpi, "rebuild nodes");
  RSS(ref_node_synchronize_globals(ref_node), "sync, lazy delete globals");
  ref_mpi_stopwatch_stop(ref_mpi, "sync nodes");
  return REF_SUCCESS;
}